

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_number_column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::RowNumberColumnReader::InitializeRead
          (RowNumberColumnReader *this,idx_t row_group_idx_p,
          vector<duckdb_parquet::ColumnChunk,_true> *columns,TProtocol *protocol_p)

{
  FileMetaData *pFVar1;
  const_reference pvVar2;
  idx_t i;
  size_type __n;
  
  this->row_group_offset = 0;
  pFVar1 = ParquetReader::GetFileMetadata((this->super_ColumnReader).reader);
  for (__n = 0; row_group_idx_p != __n; __n = __n + 1) {
    pvVar2 = vector<duckdb_parquet::RowGroup,_true>::get<true>(&pFVar1->row_groups,__n);
    this->row_group_offset = this->row_group_offset + pvVar2->num_rows;
  }
  return;
}

Assistant:

void RowNumberColumnReader::InitializeRead(idx_t row_group_idx_p, const vector<ColumnChunk> &columns,
                                           TProtocol &protocol_p) {
	row_group_offset = 0;
	auto &row_groups = reader.GetFileMetadata()->row_groups;
	for (idx_t i = 0; i < row_group_idx_p; i++) {
		row_group_offset += row_groups[i].num_rows;
	}
}